

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O0

void __thiscall btHashedSimplePairCache::removeAllPairs(btHashedSimplePairCache *this)

{
  undefined8 in_RDI;
  btAlignedObjectArray<btSimplePair> *unaff_retaddr;
  int initialAllocatedSize;
  btHashedSimplePairCache *in_stack_00000030;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int _Count;
  
  _Count = (int)((ulong)in_RDI >> 0x20);
  btAlignedObjectArray<btSimplePair>::clear
            ((btAlignedObjectArray<btSimplePair> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  btAlignedObjectArray<int>::clear
            ((btAlignedObjectArray<int> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  btAlignedObjectArray<int>::clear
            ((btAlignedObjectArray<int> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  btAlignedObjectArray<btSimplePair>::reserve(unaff_retaddr,_Count);
  growTables(in_stack_00000030);
  return;
}

Assistant:

void btHashedSimplePairCache::removeAllPairs()
{
	m_overlappingPairArray.clear();
	m_hashTable.clear();
	m_next.clear();

	int initialAllocatedSize= 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
	growTables();
}